

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall
QPDFLogger::setOutputStreams(QPDFLogger *this,ostream *out_stream,ostream *err_stream)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<Pipeline> local_80;
  shared_ptr<Pl_OStream> local_70 [2];
  shared_ptr<Pl_OStream> local_50;
  undefined1 local_40 [8];
  shared_ptr<Pipeline> new_err;
  shared_ptr<Pipeline> new_out;
  ostream *err_stream_local;
  ostream *out_stream_local;
  QPDFLogger *this_local;
  
  err_stream_local = out_stream;
  if (out_stream == (ostream *)&std::cout) {
    err_stream_local = (ostream *)0x0;
  }
  new_out.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err_stream;
  if (err_stream == (ostream *)&std::cerr) {
    new_out.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::shared_ptr<Pipeline>::shared_ptr
            ((shared_ptr<Pipeline> *)
             &new_err.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)local_40);
  if (err_stream_local == (ostream *)0x0) {
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar3 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar1 = std::operator==(&peVar2->p_save,&peVar3->p_stdout);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::shared_ptr<Pipeline>::operator=
                ((shared_ptr<Pipeline> *)
                 &new_err.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &peVar2->p_stderr);
    }
    else {
      peVar2 = std::
               __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::shared_ptr<Pipeline>::operator=
                ((shared_ptr<Pipeline> *)
                 &new_err.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &peVar2->p_stdout);
    }
  }
  else {
    std::make_shared<Pl_OStream,char_const(&)[7],std::ostream&>
              ((char (*) [7])&local_50,(basic_ostream<char,_std::char_traits<char>_> *)0x41f0e3);
    std::shared_ptr<Pipeline>::operator=
              ((shared_ptr<Pipeline> *)
               &new_err.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_50);
    std::shared_ptr<Pl_OStream>::~shared_ptr(&local_50);
  }
  if (new_out.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_40,&peVar2->p_stderr);
  }
  else {
    std::make_shared<Pl_OStream,char_const(&)[13],std::ostream&>
              ((char (*) [13])local_70,
               (basic_ostream<char,_std::char_traits<char>_> *)"error output");
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_40,local_70);
    std::shared_ptr<Pl_OStream>::~shared_ptr(local_70);
  }
  peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<Pipeline>::operator=
            (&peVar2->p_info,
             (shared_ptr<Pipeline> *)
             &new_err.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Pipeline>::shared_ptr(&local_80,(nullptr_t)0x0);
  peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<Pipeline>::operator=(&peVar2->p_warn,&local_80);
  std::shared_ptr<Pipeline>::~shared_ptr(&local_80);
  peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<Pipeline>::operator=(&peVar2->p_error,(shared_ptr<Pipeline> *)local_40);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_40);
  std::shared_ptr<Pipeline>::~shared_ptr
            ((shared_ptr<Pipeline> *)
             &new_err.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFLogger::setOutputStreams(std::ostream* out_stream, std::ostream* err_stream)
{
    if (out_stream == &std::cout) {
        out_stream = nullptr;
    }
    if (err_stream == &std::cerr) {
        err_stream = nullptr;
    }
    std::shared_ptr<Pipeline> new_out;
    std::shared_ptr<Pipeline> new_err;

    if (out_stream == nullptr) {
        if (m->p_save == m->p_stdout) {
            new_out = m->p_stderr;
        } else {
            new_out = m->p_stdout;
        }
    } else {
        new_out = std::make_shared<Pl_OStream>("output", *out_stream);
    }
    if (err_stream == nullptr) {
        new_err = m->p_stderr;
    } else {
        new_err = std::make_shared<Pl_OStream>("error output", *err_stream);
    }
    m->p_info = new_out;
    m->p_warn = nullptr;
    m->p_error = new_err;
}